

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDEdge::RemoveFaceFromArray(ON_SubDEdge *this,ON_SubDFace *f)

{
  ushort uVar1;
  ON_SubDFacePtr *pOVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (f != (ON_SubDFace *)0x0) {
    uVar1 = this->m_face_count;
    uVar3 = (ulong)uVar1;
    if (uVar3 < 3) {
      for (lVar4 = 0xe; lVar4 - uVar3 != 0xe; lVar4 = lVar4 + 1) {
        if ((ON_SubDFace *)
            ((ulong)(this->super_ON_SubDComponentBase).m_saved_subd_point1[lVar4 + -4] &
            0xfffffffffffffff8) == f) goto LAB_005d497d;
      }
    }
    else {
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        if ((ON_SubDFace *)(this->m_face2[lVar4].m_ptr & 0xfffffffffffffff8) == f) {
          if (lVar4 == 0) {
            this->m_face2[0].m_ptr = this->m_face2[1].m_ptr;
          }
          pOVar2 = this->m_facex;
          this->m_face2[1].m_ptr = pOVar2->m_ptr;
          for (uVar5 = 3; uVar5 < uVar3; uVar5 = uVar5 + 1) {
            pOVar2[uVar5 - 3].m_ptr = pOVar2[uVar5 - 2].m_ptr;
          }
          goto LAB_005d49e0;
        }
      }
      pOVar2 = this->m_facex;
      for (uVar5 = 3; (2 - uVar3) + uVar5 != 3; uVar5 = uVar5 + 1) {
        if ((ON_SubDFace *)(pOVar2[uVar5 - 3].m_ptr & 0xfffffffffffffff8) == f) goto LAB_005d49db;
      }
    }
  }
  return false;
LAB_005d49db:
  for (; uVar5 < uVar3; uVar5 = uVar5 + 1) {
    pOVar2[uVar5 - 3].m_ptr = pOVar2[uVar5 - 2].m_ptr;
  }
  goto LAB_005d49e0;
LAB_005d497d:
  for (; lVar4 - 0xdU < uVar3; lVar4 = lVar4 + 1) {
    (this->super_ON_SubDComponentBase).m_saved_subd_point1[lVar4 + -4] =
         (this->super_ON_SubDComponentBase).m_saved_subd_point1[lVar4 + -3];
  }
LAB_005d49e0:
  this->m_face_count = uVar1 - 1;
  return true;
}

Assistant:

bool ON_SubDEdge::RemoveFaceFromArray(
  const ON_SubDFace* f
  )
{
  unsigned int i;
  if (nullptr == f)
    return false;

  if (m_face_count <= 2)
  {
    for (i = 0; i < m_face_count; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[i].m_ptr))
      {
        for (i++; i < m_face_count; i++)
          m_face2[i - 1] = m_face2[i];
        m_face_count--;
        return true;
      }
    }
  }
  else
  {
    for (i = 0; i < 2; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[i].m_ptr))
      {
        for (i++; i < 2; i++)
          m_face2[i - 1] = m_face2[i];
        m_face2[1] = m_facex[0];
        for (i = 3; i < m_face_count; i++)
          m_facex[i - 3] = m_facex[i - 2];
        m_face_count--;
        return true;
      }
    }
    for (i = 2; i < m_face_count; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_facex[i - 2].m_ptr))
      {
        for (i++; i < m_face_count; i++)
          m_facex[i - 3] = m_facex[i - 2];
        m_face_count--;
        return true;
      }
    }
  }

  return false;
}